

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_buf.c
# Opt level: O1

size_t ares_buf_consume_charset(ares_buf_t *buf,uchar *charset,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uchar *puVar4;
  size_t sVar5;
  size_t sVar6;
  
  if ((buf == (ares_buf_t *)0x0) || (buf->data == (uchar *)0x0)) {
    uVar3 = 0;
    puVar4 = (uchar *)0x0;
  }
  else {
    uVar3 = buf->data_len - buf->offset;
    puVar4 = (uchar *)0x0;
    if (uVar3 != 0) {
      puVar4 = buf->data + buf->offset;
    }
  }
  uVar1 = 0;
  if (((len != 0) && (charset != (uchar *)0x0)) && (puVar4 != (uchar *)0x0)) {
    uVar2 = 0;
    uVar1 = uVar2;
    if (uVar3 != 0) {
      do {
        if (len == 0) {
          sVar6 = 0;
        }
        else {
          sVar5 = 0;
          do {
            sVar6 = sVar5;
            if (puVar4[uVar2] == charset[sVar5]) break;
            sVar5 = sVar5 + 1;
            sVar6 = len;
          } while (len != sVar5);
        }
        uVar1 = uVar2;
      } while ((sVar6 != len) && (uVar2 = uVar2 + 1, uVar1 = uVar3, uVar2 != uVar3));
    }
    if (uVar1 != 0) {
      if (buf == (ares_buf_t *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = buf->data_len - buf->offset;
      }
      if (uVar1 <= uVar3) {
        buf->offset = buf->offset + uVar1;
      }
    }
  }
  return uVar1;
}

Assistant:

size_t ares_buf_consume_charset(ares_buf_t *buf, const unsigned char *charset,
                                size_t len)
{
  size_t               remaining_len = 0;
  const unsigned char *ptr           = ares_buf_fetch(buf, &remaining_len);
  size_t               i;

  if (ptr == NULL || charset == NULL || len == 0) {
    return 0;
  }

  for (i = 0; i < remaining_len; i++) {
    size_t j;
    for (j = 0; j < len; j++) {
      if (ptr[i] == charset[j]) {
        break;
      }
    }
    /* Not found */
    if (j == len) {
      break;
    }
  }

  if (i > 0) {
    ares_buf_consume(buf, i);
  }
  return i;
}